

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileio.c
# Opt level: O3

void prvTidyfilesink_putByte(void *sinkData,byte bv)

{
  undefined7 in_register_00000031;
  FILE *fout;
  
  fputc((int)CONCAT71(in_register_00000031,bv),(FILE *)sinkData);
  return;
}

Assistant:

void TIDY_CALL TY_(filesink_putByte)( void* sinkData, byte bv )
{
  FILE* fout = (FILE*) sinkData;
  fputc( bv, fout );
#if defined(ENABLE_DEBUG_LOG)
  if (fileno(fout) != 2)
  {
      if (bv != 0x0d)
      {
          /*\
           * avoid duplicate newline - SPRTF will translate an 0x0d to CRLF,
           *  and do the same with the following 0x0a
          \*/
          SPRTF("%c",bv);
      }
  }
#endif
}